

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxPlusSolverForBGs.cpp
# Opt level: O2

void __thiscall
MaxPlusSolverForBGs::MaxPlusSolverForBGs
          (MaxPlusSolverForBGs *this,size_t maxiter,string *updateType,int verbosity,double damping,
          size_t nrSolutions,size_t nrRestarts)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)updateType);
  MaxPlusSolver::MaxPlusSolver
            (&this->super_MaxPlusSolver,maxiter,&local_50,verbosity,damping,nrSolutions,nrRestarts);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

MaxPlusSolverForBGs::MaxPlusSolverForBGs(
        size_t maxiter,
        string updateType,
        int verbosity,
        double damping,
        size_t nrSolutions,
        size_t nrRestarts)
    :
    MaxPlusSolver(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
{
}